

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::CreateUtilityOutput
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *targetName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_2,cmListFileBacktrace *param_3)

{
  string *str;
  cmSourceFile *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  string local_d0;
  cmSourceFile *local_a0;
  cmSourceFile *sf;
  cmAlphaNum local_68;
  undefined1 local_31;
  cmListFileBacktrace *local_30;
  cmListFileBacktrace *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *param_2_local;
  string *targetName_local;
  cmLocalGenerator *this_local;
  string *force;
  
  local_31 = 0;
  local_30 = param_3;
  param_3_local = (cmListFileBacktrace *)param_2;
  param_2_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)targetName;
  targetName_local = (string *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  str = GetCurrentBinaryDirectory_abi_cxx11_(this);
  cmAlphaNum::cmAlphaNum(&local_68,str);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sf,"/CMakeFiles/");
  cmStrCat<std::__cxx11::string>
            (__return_storage_ptr__,&local_68,(cmAlphaNum *)&sf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_2_local);
  this_00 = cmMakefile::GetOrCreateGeneratedSource(this->Makefile,__return_storage_ptr__);
  local_a0 = this_00;
  if (this_00 == (cmSourceFile *)0x0) {
    std::operator+(&local_f8,"Could not get source file entry for ",__return_storage_ptr__);
    cmSystemTools::Error(&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"SYMBOLIC",&local_d1);
    cmSourceFile::SetProperty(this_00,&local_d0,"1");
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::CreateUtilityOutput(
  std::string const& targetName, std::vector<std::string> const&,
  cmListFileBacktrace const&)
{
  std::string force =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/", targetName);
  // The output is not actually created so mark it symbolic.
  if (cmSourceFile* sf = this->Makefile->GetOrCreateGeneratedSource(force)) {
    sf->SetProperty("SYMBOLIC", "1");
  } else {
    cmSystemTools::Error("Could not get source file entry for " + force);
  }
  return force;
}